

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

string * __thiscall
libtorrent::bdecode_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,bdecode_error_category *this,int ev)

{
  allocator<char> local_9;
  
  if ((uint)ev < 8) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               _ZZNK10libtorrent22bdecode_error_category7messageB5cxx11EiE4msgs_rel +
               *(int *)(_ZZNK10libtorrent22bdecode_error_category7messageB5cxx11EiE4msgs_rel +
                       (ulong)(uint)ev * 4),&local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Unknown error","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string bdecode_error_category::message(int ev) const
	{
		static char const* msgs[] =
		{
			"no error",
			"expected digit in bencoded string",
			"expected colon in bencoded string",
			"unexpected end of file in bencoded string",
			"expected value (list, dict, int or string) in bencoded string",
			"bencoded nesting depth exceeded",
			"bencoded item count limit exceeded",
			"integer overflow",
		};
		if (ev < 0 || ev >= int(sizeof(msgs)/sizeof(msgs[0])))
			return "Unknown error";
		return msgs[ev];
	}